

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

void __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::PrimitiveDictionary
          (PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
           *this,Allocator *allocator_p,idx_t maximum_size_p,idx_t maximum_target_capacity_p)

{
  Allocator *pAVar1;
  idx_t iVar2;
  primitive_dictionary_entry_t *ppVar3;
  undefined1 auVar4 [16];
  uint64_t uVar5;
  data_ptr_t pdVar6;
  uint32_t *puVar7;
  ulong uVar8;
  long lVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  
  this->allocator = allocator_p;
  this->maximum_size = maximum_size_p;
  this->size = 0;
  uVar5 = NextPowerOfTwo(maximum_size_p * 2);
  this->capacity = uVar5;
  this->capacity_mask = uVar5 - 1;
  this->maximum_target_capacity = maximum_target_capacity_p;
  pAVar1 = this->allocator;
  pdVar6 = Allocator::AllocateData(pAVar1,uVar5 * 0x18);
  AllocatedData::AllocatedData(&this->allocated_dictionary,pAVar1,pdVar6,uVar5 * 0x18);
  pAVar1 = this->allocator;
  iVar2 = this->capacity * 0xc;
  pdVar6 = Allocator::AllocateData(pAVar1,iVar2);
  AllocatedData::AllocatedData(&this->allocated_target,pAVar1,pdVar6,iVar2);
  MemoryStream::MemoryStream
            (&this->target_stream,(this->allocated_target).pointer,
             (this->allocated_target).allocated_size);
  iVar2 = this->capacity;
  ppVar3 = (primitive_dictionary_entry_t *)(this->allocated_dictionary).pointer;
  this->dictionary = ppVar3;
  this->full = false;
  auVar4 = _DAT_01d9fb10;
  if (iVar2 != 0) {
    uVar8 = iVar2 + 3 & 0xfffffffffffffffc;
    lVar9 = iVar2 - 1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    puVar7 = &ppVar3[3].index;
    auVar10 = auVar10 ^ _DAT_01d9fb10;
    auVar12 = _DAT_01da0bd0;
    auVar13 = _DAT_01d9fb00;
    do {
      auVar14 = auVar13 ^ auVar4;
      iVar11 = auVar10._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar11 && auVar10._0_4_ < auVar14._0_4_ ||
                  iVar11 < auVar14._4_4_) & 1)) {
        puVar7[-0x12] = 0xffffffff;
      }
      if ((auVar14._12_4_ != auVar10._12_4_ || auVar14._8_4_ <= auVar10._8_4_) &&
          auVar14._12_4_ <= auVar10._12_4_) {
        puVar7[-0xc] = 0xffffffff;
      }
      auVar14 = auVar12 ^ auVar4;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar14._0_4_ <= auVar10._0_4_)) {
        puVar7[-6] = 0xffffffff;
        *puVar7 = 0xffffffff;
      }
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar9 + 4;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar9 + 4;
      puVar7 = puVar7 + 0x18;
      uVar8 = uVar8 - 4;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

PrimitiveDictionary(Allocator &allocator_p, idx_t maximum_size_p, idx_t maximum_target_capacity_p)
	    : allocator(allocator_p), maximum_size(maximum_size_p), size(0),
	      capacity(NextPowerOfTwo(maximum_size * LOAD_FACTOR)), capacity_mask(capacity - 1),
	      maximum_target_capacity(maximum_target_capacity_p),
	      allocated_dictionary(allocator.Allocate(capacity * sizeof(primitive_dictionary_entry_t))),
	      allocated_target(allocator.Allocate(std::is_same<TGT, string_t>::value
	                                              ? MinValue(INITIAL_TARGET_CAPACITY, maximum_target_capacity)
	                                              : capacity * sizeof(TGT))),
	      target_stream(allocated_target.get(), allocated_target.GetSize()),
	      dictionary(reinterpret_cast<primitive_dictionary_entry_t *>(allocated_dictionary.get())), full(false) {
		// Initialize empty
		for (idx_t i = 0; i < capacity; i++) {
			dictionary[i].index = INVALID_INDEX;
		}
	}